

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

MOJOSHADER_parseData *
MOJOSHADER_parse(char *profile,char *mainfn,uchar *tokenbuf,uint bufsize,MOJOSHADER_swizzle *swiz,
                uint swizcount,MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                MOJOSHADER_free f,void *d)

{
  SourceMod SVar1;
  MOJOSHADER_swizzle *pMVar2;
  uint32 *tokens;
  code *pcVar3;
  RegisterList *pRVar4;
  bool bVar5;
  RegisterList *item;
  Context *ctx;
  char *pcVar6;
  MOJOSHADER_parseData *pMVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  MOJOSHADER_shaderType MVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint32 uVar18;
  SourceArgInfo *arg;
  ulong uVar17;
  
  if (((m == (MOJOSHADER_malloc)0x0 && f != (MOJOSHADER_free)0x0) ||
      (m != (MOJOSHADER_malloc)0x0 && f == (MOJOSHADER_free)0x0)) ||
     (ctx = build_context(profile,mainfn,tokenbuf,bufsize,swiz,swizcount,smap,smapcount,m,f,d),
     ctx == (Context *)0x0)) {
    return &MOJOSHADER_out_of_mem_data;
  }
  if (profile == (char *)0x0) {
    failf(ctx,"%s","Profile name is NULL");
  }
  if (ctx->isfail != 0) goto LAB_00108e07;
  if ((ulong)ctx->swizzles_count != 0) {
    pMVar2 = ctx->swizzles;
    lVar10 = 0;
    do {
      if (((3 < pMVar2->swizzles[lVar10]) || (3 < pMVar2->swizzles[lVar10 + 1])) ||
         ((3 < pMVar2->swizzles[lVar10 + 2] || (3 < pMVar2->swizzles[lVar10 + 3])))) {
        failf(ctx,"%s","invalid swizzle");
        break;
      }
      lVar10 = lVar10 + 0xc;
    } while ((ulong)ctx->swizzles_count * 0xc != lVar10);
  }
  ctx->current_position = 0;
  if (ctx->tokencount == 0) {
    bVar5 = false;
    failf(ctx,"%s","Expected version token, got none at all.");
    uVar14 = 0;
  }
  else {
    uVar14 = *ctx->tokens;
    ctx->version_token = uVar14;
    if (uVar14 >> 0x10 == 0xffff) {
      pcVar6 = "ps";
      MVar12 = MOJOSHADER_TYPE_PIXEL;
    }
    else {
      if (uVar14 >> 0x10 != 0xfffe) {
        failf(ctx,"%s","Unsupported shader type or not a shader at all");
        uVar14 = 0xffffffff;
        bVar5 = true;
        goto LAB_00108787;
      }
      pcVar6 = "vs";
      MVar12 = MOJOSHADER_TYPE_VERTEX;
    }
    ctx->shader_type = MVar12;
    ctx->shader_type_str = pcVar6;
    ctx->major_ver = (uint8)(uVar14 >> 8);
    ctx->minor_ver = (uint8)uVar14;
    uVar15 = 0;
    if ((uint8)uVar14 != 0xff) {
      uVar15 = uVar14 & 0xfe;
    }
    if (0x30001 < (uVar15 | (uVar14 >> 8 & 0xff) << 0x10)) {
      failf(ctx,"Shader Model %u.%u is currently unsupported.",(ulong)(uVar14 >> 8 & 0xff),
            (ulong)(uVar14 & 0xff));
    }
    uVar14 = 1;
    if (ctx->isfail == 0) {
      (*ctx->profile->start_emitter)(ctx,profile);
    }
    bVar5 = false;
  }
LAB_00108787:
  if (ctx->mainfn == (char *)0x0) {
    pcVar6 = (char *)(*ctx->malloc)(5,ctx->malloc_data);
    if (pcVar6 == (char *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      builtin_strncpy(pcVar6,"main",5);
    }
    ctx->mainfn = pcVar6;
  }
  if (!bVar5) {
    uVar15 = ctx->tokencount;
    if (ctx->tokencount < uVar14) {
      failf(ctx,"%s","Corrupted or truncated shader");
      uVar15 = uVar14;
    }
    puVar13 = ctx->tokens + uVar14;
    ctx->tokens = puVar13;
    iVar11 = uVar14 * 4 + ctx->current_position;
    bVar5 = false;
    uVar18 = uVar15 - uVar14;
    ctx->tokencount = uVar18;
    ctx->current_position = iVar11;
    if (uVar18 != 0) {
      bVar5 = false;
      do {
        if (ctx->know_shader_size == 0) {
          ctx->tokencount = 0xffffffff;
          uVar18 = 0xffffffff;
        }
        if (ctx->isfail != 0) {
          ctx->isfail = 0;
          bVar5 = true;
        }
        if (ctx->output_stack_len != 0) {
          __assert_fail("ctx->output_stack_len == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                        ,0x2b63,"int parse_token(Context *)");
        }
        if (uVar18 == 0) {
          failf(ctx,"%s","unexpected end of shader.");
          goto LAB_001088df;
        }
        uVar14 = *puVar13;
        uVar15 = uVar14 & 0xffff;
        uVar17 = (ulong)uVar15;
        if (uVar17 == 0xfffe) {
          if ((int)uVar14 < 0) {
            failf(ctx,"%s","comment token high bit must be zero.");
            uVar18 = ctx->tokencount;
LAB_0010897c:
            uVar15 = uVar14 >> 0x10;
            if (uVar15 < uVar18) {
              tokens = ctx->tokens;
              if (tokens[1] == 0x42415443) {
                parse_constant_table(ctx,tokens,uVar15 * 4,ctx->version_token,1,&ctx->ctab);
              }
              else if (tokens[1] == 0x53455250) {
                parse_preshader(ctx,tokens + 2,uVar15 - 2);
              }
            }
          }
          else if (0x1ffff < uVar14) goto LAB_0010897c;
          uVar16 = (uVar14 >> 0x10) + 1;
        }
        else if (uVar14 == 0xfffd) {
          if (((ctx->shader_type != MOJOSHADER_TYPE_PIXEL) || (ctx->major_ver != '\x01')) ||
             (ctx->minor_ver != '\x04')) {
            failf(ctx,"%s","phase token only available in 1.4 pixel shaders");
            uVar16 = 1;
            if (ctx->isfail != 0) goto LAB_00108d03;
          }
          (*ctx->profile->phase_emitter)(ctx);
LAB_001088f6:
          uVar16 = 1;
        }
        else {
          if (uVar14 == 0xffff) {
            if (ctx->know_shader_size == 0) {
              ctx->tokencount = 1;
            }
            else if (uVar18 != 1) {
              failf(ctx,"%s","end token before end of stream");
              uVar16 = 1;
              if (ctx->isfail != 0) goto LAB_00108d03;
            }
            (*ctx->profile->end_emitter)(ctx);
            goto LAB_001088f6;
          }
          if (0x60 < uVar15) {
LAB_001088df:
            failf(ctx,"unknown token (0x%x)",(ulong)*ctx->tokens);
            goto LAB_001088f6;
          }
          pcVar3 = *(code **)(uVar17 * 0x48 + 0x13e0c0 + (long)ctx->profileid * 8);
          if ((int)uVar14 < 0) {
            failf(ctx,"%s","instruction token high bit must be zero.");
          }
          uVar8 = uVar14 >> 0x18 & 0xf;
          pcVar6 = instructions[uVar17].opcode_string;
          if (pcVar6 == (char *)0x0) {
            failf(ctx,"%s","Unknown opcode.");
LAB_00108d78:
            uVar16 = uVar8 + 1;
          }
          else {
            ctx->coissue = (uVar14 & 0x40000000) >> 0x1e;
            if ((uVar14 & 0x40000000) != 0) {
              if (ctx->shader_type != MOJOSHADER_TYPE_PIXEL) {
                failf(ctx,"%s","coissue instruction on non-pixel shader");
              }
              if (1 < ctx->major_ver) {
                failf(ctx,"%s","coissue instruction in Shader Model >= 2.0");
              }
            }
            if ((ctx->shader_type & instructions[uVar17].shader_types) == MOJOSHADER_TYPE_UNKNOWN) {
              failf(ctx,"opcode \'%s\' not available in this shader type.",pcVar6);
            }
            ctx->dwords[0] = 0;
            ctx->dwords[1] = 0;
            ctx->dwords[2] = 0;
            ctx->dwords[3] = 0;
            ctx->instruction_controls = uVar14 >> 0x10 & 0xff;
            ctx->predicated = (uVar14 & 0x10000000) >> 0x1c;
            ctx->tokens = ctx->tokens + 1;
            ctx->tokencount = ctx->tokencount - 1;
            ctx->current_position = ctx->current_position + 4;
            uVar16 = (*instructions[uVar17].parse_args)(ctx);
            if ((uVar14 & 0x10000000) != 0) {
              parse_source_token(ctx,&ctx->predicate_arg);
              if ((ctx->predicate_arg).regtype != REG_TYPE_MAX) {
                failf(ctx,"%s","Predicated instruction but not predicate register!");
              }
              SVar1 = (ctx->predicate_arg).src_mod;
              if ((SVar1 != SRCMOD_NONE) && (SVar1 != SRCMOD_NOT)) {
                failf(ctx,"%s","Predicated instruction register is not NONE or NOT");
              }
              uVar14 = (ctx->predicate_arg).swizzle;
              if ((uVar14 != 0xe4) &&
                 (((uVar9 = uVar14 & 3, uVar9 != (uVar14 >> 2 & 3) || (uVar9 != (uVar14 >> 4 & 3)))
                  || (uVar9 != (uVar14 >> 6 & 3))))) {
                failf(ctx,"%s","Predicated instruction register has wrong swizzle");
              }
              if ((ctx->predicate_arg).relative != 0) {
                failf(ctx,"%s","relative addressing in predicated token");
              }
              uVar16 = uVar16 + 1;
            }
            ctx->tokens = puVar13;
            ctx->tokencount = uVar18;
            ctx->current_position = iVar11;
            if (instructions[uVar17].state != (state_function)0x0) {
              (*instructions[uVar17].state)(ctx);
            }
            ctx->instruction_count = ctx->instruction_count + instructions[uVar17].slots;
            if (ctx->isfail == 0) {
              (*pcVar3)(ctx);
            }
            if (ctx->reset_texmpad != 0) {
              ctx->texm3x2pad_dst0 = -1;
              ctx->texm3x2pad_src0 = -1;
              ctx->texm3x3pad_dst0 = -1;
              ctx->texm3x3pad_src0 = -1;
              ctx->texm3x3pad_dst1 = -1;
              ctx->texm3x3pad_src1 = -1;
              ctx->reset_texmpad = 0;
            }
            ctx->previous_opcode = uVar15;
            ctx->scratch_registers = 0;
            if (ctx->major_ver < 2) {
              if (uVar8 != 0) {
                failf(ctx,"%s","instruction token count must be zero");
              }
              if (uVar16 == 0) goto LAB_001088df;
            }
            else if (uVar16 != uVar8 + 1) {
              failf(ctx,"wrong token count (%u, not %u) for opcode \'%s\'.",(ulong)uVar16,
                    (ulong)(uVar8 + 1),pcVar6);
              goto LAB_00108d78;
            }
          }
        }
LAB_00108d03:
        if (ctx->tokencount < uVar16) {
          failf(ctx,"%s","Corrupted or truncated shader");
          break;
        }
        puVar13 = ctx->tokens + (int)uVar16;
        ctx->tokens = puVar13;
        iVar11 = uVar16 * 4 + ctx->current_position;
        uVar18 = ctx->tokencount - uVar16;
        ctx->tokencount = uVar18;
        ctx->current_position = iVar11;
      } while (uVar18 != 0);
    }
    ctx->current_position = -1;
    if (((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) && (ctx->major_ver < 2)) &&
       ((pRVar4 = (ctx->used_registers).next, pRVar4 == (RegisterList *)0x0 ||
        (((pRVar4->regtype & 0xffff) != REG_TYPE_TEMP || pRVar4->regnum != 0 ||
         (pRVar4->written == 0)))))) {
      failf(ctx,"%s","r0 (pixel shader 1.x color output) never written to");
    }
    iVar11 = 1;
    if (!bVar5) {
      process_definitions(ctx);
      iVar11 = ctx->isfail;
      if (iVar11 == 0) {
        (*ctx->profile->finalize_emitter)(ctx);
        iVar11 = 0;
      }
    }
    ctx->isfail = iVar11;
  }
LAB_00108e07:
  pMVar7 = build_parsedata(ctx);
  destroy_context(ctx);
  return pMVar7;
}

Assistant:

const MOJOSHADER_parseData *MOJOSHADER_parse(const char *profile,
                                             const char *mainfn,
                                             const unsigned char *tokenbuf,
                                             const unsigned int bufsize,
                                             const MOJOSHADER_swizzle *swiz,
                                             const unsigned int swizcount,
                                             const MOJOSHADER_samplerMap *smap,
                                             const unsigned int smapcount,
                                             MOJOSHADER_malloc m,
                                             MOJOSHADER_free f, void *d)
{
    MOJOSHADER_parseData *retval = NULL;
    Context *ctx = NULL;
    int rc = 0;
    int failed = 0;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_data;  // supply both or neither.

    ctx = build_context(profile, mainfn, tokenbuf, bufsize, swiz, swizcount,
                        smap, smapcount, m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_data;

    if (profile == NULL)  // build_context allows NULL; check this ourselves.
        fail(ctx, "Profile name is NULL");

    if (isfail(ctx))
    {
        retval = build_parsedata(ctx);
        destroy_context(ctx);
        return retval;
    } // if

    verify_swizzles(ctx);

    // Version token always comes first.
    ctx->current_position = 0;
    rc = parse_version_token(ctx, profile);

    if (!ctx->mainfn)
        ctx->mainfn = StrDup(ctx, "main");

    // drop out now if this definitely isn't bytecode. Saves lots of
    //  meaningless errors flooding through.
    if (rc < 0)
    {
        retval = build_parsedata(ctx);
        destroy_context(ctx);
        return retval;
    } // if

    if ( ((uint32) rc) > ctx->tokencount )
    {
        fail(ctx, "Corrupted or truncated shader");
        ctx->tokencount = rc;
    } // if

    adjust_token_position(ctx, rc);

    // parse out the rest of the tokens after the version token...
    while (ctx->tokencount > 0)
    {
        if (!ctx->know_shader_size)
            ctx->tokencount = 0xFFFFFFFF;  // keep this value obscenely large.

        // reset for each token.
        if (isfail(ctx))
        {
            failed = 1;
            ctx->isfail = 0;
        } // if

        rc = parse_token(ctx);
        if ( ((uint32) rc) > ctx->tokencount )
        {
            fail(ctx, "Corrupted or truncated shader");
            break;
        } // if

        adjust_token_position(ctx, rc);
    } // while

    ctx->current_position = MOJOSHADER_POSITION_AFTER;

    // for ps_1_*, the output color is written to r0...throw an
    //  error if this register was never written. This isn't
    //  important for vertex shaders, or shader model 2+.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        if (!register_was_written(ctx, REG_TYPE_TEMP, 0))
            fail(ctx, "r0 (pixel shader 1.x color output) never written to");
    } // if

    if (!failed)
    {
        process_definitions(ctx);
        failed = isfail(ctx);
    } // if

    if (!failed)
        ctx->profile->finalize_emitter(ctx);

    ctx->isfail = failed;
    retval = build_parsedata(ctx);
    destroy_context(ctx);
    return retval;
}